

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O2

void __thiscall
dlib::array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>::
set_max_size(array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>
             *this,unsigned_long max)

{
  tab_data *ptVar1;
  
  (*(this->super_enumerable<dlib::tabbed_display::tab_data>)._vptr_enumerable[3])();
  this->array_size = 0;
  this->last_pos = (tab_data *)0x0;
  if (max == 0) {
    if (this->array_elements != (tab_data *)0x0) {
      memory_manager_stateless_kernel_1<dlib::tabbed_display::tab_data>::deallocate_array
                (&this->pool,this->array_elements);
    }
    this->max_array_size = 0;
    this->array_elements = (tab_data *)0x0;
  }
  else if (this->max_array_size != max) {
    if (this->array_elements != (tab_data *)0x0) {
      memory_manager_stateless_kernel_1<dlib::tabbed_display::tab_data>::deallocate_array
                (&this->pool,this->array_elements);
    }
    ptVar1 = memory_manager_stateless_kernel_1<dlib::tabbed_display::tab_data>::allocate_array
                       (&this->pool,max);
    this->array_elements = ptVar1;
    this->max_array_size = max;
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    set_max_size(
        unsigned long max
    )
    {
        reset();
        array_size = 0;
        last_pos = 0;
        if (max != 0)
        {
            // if new max size is different
            if (max != max_array_size)
            {
                if (array_elements)
                {
                    pool.deallocate_array(array_elements);
                }
                // try to get more memroy
                try { array_elements = pool.allocate_array(max); }
                catch (...) { array_elements = 0;  max_array_size = 0; throw; }
                max_array_size = max;
            }

        }
        // if the array is being made to be zero
        else
        {
            if (array_elements)
                pool.deallocate_array(array_elements);
            max_array_size = 0;
            array_elements = 0;
        }
    }